

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_projection.hpp
# Opt level: O2

Matrix4<float> *
eos::render::ortho<float>
          (Matrix4<float> *__return_storage_ptr__,float left,float right,float bottom,float top)

{
  float in_XMM0_Db;
  float in_XMM1_Db;
  float in_XMM2_Db;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float in_XMM3_Db;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_5b [3];
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  float local_28;
  float fStack_24;
  
  local_58 = right;
  fStack_54 = in_XMM1_Db;
  local_48 = left;
  fStack_44 = in_XMM0_Db;
  local_38 = top;
  fStack_34 = in_XMM3_Db;
  local_28 = bottom;
  fStack_24 = in_XMM2_Db;
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)__return_storage_ptr__,local_5b);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0] = 2.0 / (local_58 - local_48);
  auVar1._0_8_ = CONCAT44(local_28 + local_38,local_48 + local_58) ^ 0x8000000080000000;
  auVar1._8_4_ = -(fStack_44 + fStack_54);
  auVar1._12_4_ = -(fStack_24 + fStack_34);
  auVar2._4_4_ = local_38 - local_28;
  auVar2._0_4_ = local_58 - local_48;
  auVar2._8_4_ = fStack_54 - fStack_44;
  auVar2._12_4_ = fStack_34 - fStack_24;
  auVar2 = divps(auVar1,auVar2);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[5] = 2.0 / (local_38 - local_28);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[10] = -1.0;
  *(long *)((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 0xc) = auVar2._0_8_;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix4<T> ortho(T left, T right, T bottom, T top)
{
    Eigen::Matrix4<T> result = Eigen::Matrix4<T>::Identity();
    result(0, 0) = static_cast<T>(2) / (right - left);
    result(1, 1) = static_cast<T>(2) / (top - bottom);
    result(2, 2) = -static_cast<T>(1);
    result(0, 3) = -(right + left) / (right - left);
    result(1, 3) = -(top + bottom) / (top - bottom);
    return result;
}